

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O0

bool __thiscall
ON_CurveProxy::Split(ON_CurveProxy *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval real_curve_subdomain;
  ON_Interval real_curve_subdomain_00;
  bool bVar1;
  byte bVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  undefined1 local_b0 [8];
  ON_Interval d;
  ON_Curve *real_crv;
  ON_Interval right_this_dom;
  ON_Interval left_this_dom;
  ON_Interval right_real_dom;
  ON_Interval left_real_dom;
  ON_CurveProxy *pOStack_50;
  bool bRev;
  ON_CurveProxy *right_proxy;
  ON_CurveProxy *left_proxy;
  double crv_t;
  bool rc;
  ON_Curve **right_side_local;
  ON_Curve **left_side_local;
  double t_local;
  ON_CurveProxy *this_local;
  
  this_local._7_1_ = false;
  bVar1 = ON_Interval::IsIncreasing(&this->m_this_domain);
  if (((bVar1) && (bVar1 = ON_Interval::IsIncreasing(&this->m_real_curve_domain), bVar1)) &&
     (bVar1 = ON_Interval::Includes(&this->m_this_domain,t,true), bVar1)) {
    dVar4 = RealCurveParameter(this,t);
    bVar1 = ON_Interval::Includes(&this->m_real_curve_domain,dVar4,true);
    if (bVar1) {
      right_proxy = (ON_CurveProxy *)0x0;
      pOStack_50 = (ON_CurveProxy *)0x0;
      if ((*left_side == (ON_Curve *)0x0) ||
         (right_proxy = Cast((ON_Object *)*left_side), right_proxy != (ON_CurveProxy *)0x0)) {
        if (*right_side != (ON_Curve *)0x0) {
          pOStack_50 = Cast((ON_Object *)*right_side);
          if (pOStack_50 == (ON_CurveProxy *)0x0) {
            return false;
          }
          if (*right_side == *left_side) {
            return false;
          }
        }
        bVar2 = this->m_bReversed & 1;
        ON_Interval::ON_Interval((ON_Interval *)(right_real_dom.m_t + 1));
        ON_Interval::ON_Interval((ON_Interval *)(left_this_dom.m_t + 1));
        if (bVar2 == 0) {
          dVar5 = ON_Interval::operator[](&this->m_real_curve_domain,0);
          ON_Interval::Set((ON_Interval *)(right_real_dom.m_t + 1),dVar5,dVar4);
          dVar5 = ON_Interval::operator[](&this->m_real_curve_domain,1);
          ON_Interval::Set((ON_Interval *)(left_this_dom.m_t + 1),dVar4,dVar5);
        }
        else {
          dVar5 = ON_Interval::operator[](&this->m_real_curve_domain,1);
          ON_Interval::Set((ON_Interval *)(right_real_dom.m_t + 1),dVar4,dVar5);
          dVar5 = ON_Interval::operator[](&this->m_real_curve_domain,0);
          ON_Interval::Set((ON_Interval *)(left_this_dom.m_t + 1),dVar5,dVar4);
        }
        dVar4 = ON_Interval::operator[](&this->m_this_domain,0);
        ON_Interval::ON_Interval((ON_Interval *)(right_this_dom.m_t + 1),dVar4,t);
        dVar4 = ON_Interval::operator[](&this->m_this_domain,1);
        ON_Interval::ON_Interval((ON_Interval *)&real_crv,t,dVar4);
        bVar1 = ON_Interval::IsIncreasing((ON_Interval *)(right_real_dom.m_t + 1));
        if (((bVar1) &&
            (bVar1 = ON_Interval::IsIncreasing((ON_Interval *)(left_this_dom.m_t + 1)), bVar1)) &&
           ((bVar1 = ON_Interval::IsIncreasing((ON_Interval *)(right_this_dom.m_t + 1)), bVar1 &&
            (bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&real_crv), bVar1)))) {
          d.m_t[1] = (double)this->m_real_curve;
          if ((ON_Curve *)d.m_t[1] != (ON_Curve *)0x0) {
            (*(((ON_Curve *)d.m_t[1])->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
            d.m_t[0] = dVar4;
            bVar1 = ON_Interval::Includes
                              ((ON_Interval *)local_b0,(ON_Interval *)(right_real_dom.m_t + 1),false
                              );
            if (!bVar1) {
              return false;
            }
            bVar1 = ON_Interval::Includes
                              ((ON_Interval *)local_b0,(ON_Interval *)(left_this_dom.m_t + 1),false)
            ;
            if (!bVar1) {
              return false;
            }
          }
          if (right_proxy == (ON_CurveProxy *)0x0) {
            right_proxy = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(right_proxy);
          }
          if (pOStack_50 == (ON_CurveProxy *)0x0) {
            pOStack_50 = (ON_CurveProxy *)operator_new(0x40);
            ON_CurveProxy(pOStack_50);
          }
          real_curve_subdomain_00.m_t[1] = left_real_dom.m_t[0];
          real_curve_subdomain_00.m_t[0] = right_real_dom.m_t[1];
          SetProxyCurve(right_proxy,(ON_Curve *)d.m_t[1],real_curve_subdomain_00);
          real_curve_subdomain.m_t[1] = right_real_dom.m_t[0];
          real_curve_subdomain.m_t[0] = left_this_dom.m_t[1];
          SetProxyCurve(pOStack_50,(ON_Curve *)d.m_t[1],real_curve_subdomain);
          if (bVar2 != 0) {
            (*(right_proxy->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      ();
            (*(pOStack_50->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x38])
                      ();
          }
          pdVar3 = ON_Interval::operator[]((ON_Interval *)(right_this_dom.m_t + 1),0);
          dVar4 = *pdVar3;
          pdVar3 = ON_Interval::operator[]((ON_Interval *)(right_this_dom.m_t + 1),1);
          (*(right_proxy->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar4,*pdVar3);
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&real_crv,0);
          dVar4 = *pdVar3;
          pdVar3 = ON_Interval::operator[]((ON_Interval *)&real_crv,1);
          (*(pOStack_50->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar4,*pdVar3);
          if (*left_side == (ON_Curve *)0x0) {
            *left_side = &right_proxy->super_ON_Curve;
          }
          if (*right_side == (ON_Curve *)0x0) {
            *right_side = &pOStack_50->super_ON_Curve;
          }
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_CurveProxy::Split(
    double t,
    ON_Curve*& left_side,
    ON_Curve*& right_side
  ) const
{
  bool rc = false;
  if ( m_this_domain.IsIncreasing() && m_real_curve_domain.IsIncreasing() && m_this_domain.Includes(t,true) )
  {
    double crv_t = RealCurveParameter(t);
    if ( m_real_curve_domain.Includes(crv_t,true) )
    {
      ON_CurveProxy* left_proxy = 0;
      ON_CurveProxy* right_proxy = 0;
      if ( left_side )
      {
        left_proxy = ON_CurveProxy::Cast(left_side);
        if ( !left_proxy )
          return false;
      }
      if ( right_side )
      {
        right_proxy = ON_CurveProxy::Cast(right_side);
        if ( !right_proxy )
          return false;
        if ( right_side == left_side )
          return false;
      }

      bool bRev = m_bReversed;

      ON_Interval left_real_dom, right_real_dom;
      if ( bRev )
      {
        left_real_dom.Set(crv_t,m_real_curve_domain[1]);
        right_real_dom.Set(m_real_curve_domain[0],crv_t);
      }
      else
      {
        left_real_dom.Set(m_real_curve_domain[0],crv_t);
        right_real_dom.Set(crv_t,m_real_curve_domain[1]);
      }

      ON_Interval left_this_dom(m_this_domain[0],t);
      ON_Interval right_this_dom(t,m_this_domain[1]);

      if (    left_real_dom.IsIncreasing() 
           && right_real_dom.IsIncreasing()
           && left_this_dom.IsIncreasing()
           && right_this_dom.IsIncreasing()
           )
      {
        // note well that left_proxy or right_proxy might also be this
        const ON_Curve* real_crv = m_real_curve;
        if ( real_crv )
        {
          ON_Interval d = real_crv->Domain();
          if ( !d.Includes(left_real_dom) )
            return false;
          if ( !d.Includes(right_real_dom) )
            return false;
        }

        if ( !left_proxy )
          left_proxy = new ON_CurveProxy();
        if ( !right_proxy )
          right_proxy = new ON_CurveProxy();

        left_proxy->SetProxyCurve( real_crv, left_real_dom );
        right_proxy->SetProxyCurve( real_crv, right_real_dom );

        if ( bRev )
        {
          left_proxy->Reverse();
          right_proxy->Reverse();
        }

        left_proxy->SetDomain(left_this_dom[0],left_this_dom[1]);
        right_proxy->SetDomain(right_this_dom[0],right_this_dom[1]);

        if (!left_side) left_side = left_proxy;
        if (!right_side) right_side = right_proxy;

        rc = true;
      }
    }
  }
  return rc;
}